

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_c_string_literal.c
# Opt level: O0

void BinarySink_put_c_string_literal(BinarySink *bs,ptrlen str)

{
  byte val;
  BinarySink *pBVar1;
  ptrlen pVar2;
  byte *pbStack_28;
  char c;
  char *p;
  BinarySink *bs_local;
  ptrlen str_local;
  
  for (pbStack_28 = (byte *)str.ptr; pbStack_28 < (byte *)((long)str.ptr + str.len);
      pbStack_28 = pbStack_28 + 1) {
    val = *pbStack_28;
    if (val == 10) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\n",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (val == 0xd) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\r",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (val == 9) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\t",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (val == 8) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\b",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (val == 0x5c) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\\\",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (val == 0x22) {
      pBVar1 = bs->binarysink_;
      pVar2 = make_ptrlen("\\\"",2);
      BinarySink_put_datapl(pBVar1,pVar2);
    }
    else if (((char)val < ' ') || ('~' < (char)val)) {
      BinarySink_put_fmt(bs->binarysink_,"\\%03o",(ulong)val);
    }
    else {
      BinarySink_put_byte(bs->binarysink_,val);
    }
  }
  return;
}

Assistant:

void BinarySink_put_c_string_literal(BinarySink *bs, ptrlen str)
{
    for (const char *p = str.ptr; p < (const char *)str.ptr + str.len; p++) {
        char c = *p;

        if (c == '\n')
            put_datalit(bs, "\\n");
        else if (c == '\r')
            put_datalit(bs, "\\r");
        else if (c == '\t')
            put_datalit(bs, "\\t");
        else if (c == '\b')
            put_datalit(bs, "\\b");
        else if (c == '\\')
            put_datalit(bs, "\\\\");
        else if (c == '"')
            put_datalit(bs, "\\\"");
        else if (c >= 32 && c <= 126)
            put_byte(bs, c);
        else
            put_fmt(bs, "\\%03o", (unsigned)c & 0xFFU);
    }
}